

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
pegmatite::AsciiFileInput::fillBuffer(AsciiFileInput *this,Index start,Index *length,char32_t **b)

{
  Index IVar1;
  char32_t *pcVar2;
  ssize_t sVar3;
  ulong uVar4;
  ulong uVar5;
  Index IVar6;
  char buffer [512];
  char local_238 [520];
  
  if (this->file_size < start) {
    return false;
  }
  uVar4 = 0x200;
  if (*length < 0x200) {
    uVar4 = *length;
  }
  *length = uVar4;
  uVar5 = this->file_size - start;
  if (uVar4 <= uVar5) {
    uVar5 = uVar4;
  }
  *length = uVar5;
  do {
    sVar3 = pread(this->fd,local_238,*length,start);
    if (sVar3 < 1) {
      return 0 < sVar3;
    }
    IVar1 = *length;
    uVar5 = uVar5 - IVar1;
  } while (uVar5 != 0);
  if (IVar1 != 0) {
    pcVar2 = *b;
    IVar6 = 0;
    do {
      pcVar2[IVar6] = (int)local_238[IVar6];
      IVar6 = IVar6 + 1;
    } while (IVar1 != IVar6);
  }
  return 0 < sVar3;
}

Assistant:

bool AsciiFileInput::fillBuffer(Index start, Index &length, char32_t *&b)
{
	if (start > file_size)
	{
		return false;
	}
	char buffer[static_buffer_size];
	// This should be a no-op
	length = std::min(length, static_buffer_size);
	length = std::min(length, file_size - start);
	Index bytes_to_read = length;
	do {
		ssize_t ret = pread(fd, buffer, length,
		                    static_cast<off_t>(start));
		if (ret < 1)
		{
			return false;
		}
		bytes_to_read -= length;
	} while (bytes_to_read > 0);
	for (Index i=0 ; i<length ; i++)
	{
		b[i] = static_cast<char32_t>(buffer[i]);
	}
	return true;
}